

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O0

void __thiscall arangodb::velocypack::Parser::Parser(Parser *this,Options *options)

{
  char *msg;
  element_type *peVar1;
  Options *in_RSI;
  __shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2> *in_RDI;
  shared_ptr<arangodb::velocypack::Builder> *in_stack_ffffffffffffffb8;
  shared_ptr<arangodb::velocypack::Builder> *in_stack_ffffffffffffffc0;
  Exception *in_stack_ffffffffffffffd0;
  
  std::shared_ptr<arangodb::velocypack::Builder>::shared_ptr
            ((shared_ptr<arangodb::velocypack::Builder> *)0x106f5d);
  in_RDI[1]._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  in_RDI[2]._M_ptr = (element_type *)0x0;
  in_RDI[2]._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined4 *)&in_RDI[3]._M_ptr = 0;
  in_RDI[3]._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RSI;
  if (in_RSI != (Options *)0x0) {
    std::make_shared<arangodb::velocypack::Builder>();
    std::shared_ptr<arangodb::velocypack::Builder>::operator=
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    std::shared_ptr<arangodb::velocypack::Builder>::~shared_ptr
              ((shared_ptr<arangodb::velocypack::Builder> *)0x107019);
    peVar1 = std::__shared_ptr<arangodb::velocypack::Builder,_(__gnu_cxx::_Lock_policy)2>::get
                       (in_RDI);
    in_RDI[1]._M_ptr = peVar1;
    (in_RDI[1]._M_ptr)->options = in_RSI;
    return;
  }
  msg = (char *)__cxa_allocate_exception(0x18);
  Exception::Exception(in_stack_ffffffffffffffd0,(ExceptionType)((ulong)in_RDI >> 0x20),msg);
  __cxa_throw(msg,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

explicit Parser(Options const* options)
      : _start(nullptr), _size(0), _pos(0), _nesting(0), options(options) {
    if (VELOCYPACK_UNLIKELY(options == nullptr)) {
      throw Exception(Exception::InternalError, "Options cannot be a nullptr");
    }
    _builder = std::make_shared<Builder>();
    _builderPtr = _builder.get();
    _builderPtr->options = options;
  }